

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O1

void __thiscall MipsGenerator::TranslateMULType(MipsGenerator *this,Pcode *item)

{
  undefined8 *puVar1;
  long *plVar2;
  PcodeType PVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  undefined8 *puVar13;
  long *plVar14;
  uint uVar15;
  pointer pPVar16;
  long *plVar17;
  ulong uVar18;
  FILE *pFVar19;
  MipsGenerator *this_00;
  uint __len;
  string op;
  string num3;
  string num2;
  string num1;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  pointer local_1b8;
  __buckets_ptr local_1b0;
  FILE *local_1a8;
  __node_base _Stack_1a0;
  int local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  pcVar4 = (item->m_num1)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + (item->m_num1)._M_string_length);
  local_130._M_allocated_capacity = (size_type)&local_120;
  pcVar4 = (item->m_num2)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar4,pcVar4 + (item->m_num2)._M_string_length);
  local_150._M_allocated_capacity = (size_type)&local_140;
  pcVar4 = (item->m_num3)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar4,pcVar4 + (item->m_num3)._M_string_length);
  PVar3 = item->m_op;
  local_170._M_allocated_capacity = (size_type)&local_160;
  local_170._8_8_ = 0;
  local_160._M_local_buf[0] = '\0';
  if (PVar3 == MUL) {
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"mul ","");
LAB_001563a5:
    std::__cxx11::string::operator=((string *)local_170._M_local_buf,(string *)local_1f8);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  else {
    if (PVar3 == DIV) {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"div ","");
      goto LAB_001563a5;
    }
    TranslateMULType();
  }
  this_00 = (MipsGenerator *)local_1f8;
  plVar2 = (long *)(local_1f8 + 0x10);
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"$25","");
  local_194 = PrepareStoreREG(this_00,&local_f0,&reg1_abi_cxx11_,(string *)local_1f8);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"$26","");
  uVar8 = PrepareLoadREG(this,(string *)&local_130,&reg2_abi_cxx11_,(string *)local_1f8);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  local_1f8._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"$27","");
  uVar9 = PrepareLoadREG(this,(string *)&local_150,&reg3_abi_cxx11_,(string *)local_1f8);
  if ((long *)local_1f8._0_8_ != plVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if ((uVar9 & uVar8) == 0xffffffff) {
    iVar10 = atoi((char *)local_130._M_allocated_capacity);
    iVar11 = atoi((char *)local_150._M_allocated_capacity);
    if (PVar3 == MUL) {
      uVar8 = iVar11 * iVar10;
    }
    else {
      uVar8 = iVar10 / iVar11;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "li ",&reg1_abi_cxx11_);
    plVar12 = (long *)std::__cxx11::string::append(local_1d8);
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_1f8._16_8_ = *plVar14;
      local_1f8._24_8_ = plVar12[3];
      local_1f8._0_8_ = plVar2;
    }
    else {
      local_1f8._16_8_ = *plVar14;
      local_1f8._0_8_ = (long *)*plVar12;
    }
    local_1f8._8_8_ = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    uVar9 = -uVar8;
    if (0 < (int)uVar8) {
      uVar9 = uVar8;
    }
    __len = 1;
    if (9 < uVar9) {
      uVar18 = (ulong)uVar9;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar15 = (uint)uVar18;
        if (uVar15 < 100) {
          __len = __len - 2;
          goto LAB_00156e0c;
        }
        if (uVar15 < 1000) {
          __len = __len - 1;
          goto LAB_00156e0c;
        }
        if (uVar15 < 10000) goto LAB_00156e0c;
        uVar18 = uVar18 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar15);
      __len = __len + 1;
    }
LAB_00156e0c:
    local_1b8 = (pointer)&local_1a8;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)__len - (char)((int)uVar8 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)&local_1b8->m_op + (ulong)(uVar8 >> 0x1f)),__len,uVar9);
    pFVar19 = (FILE *)0xf;
    if ((long *)local_1f8._0_8_ != plVar2) {
      pFVar19 = (FILE *)local_1f8._16_8_;
    }
    if (pFVar19 < (FILE *)((long)local_1b0 + local_1f8._8_8_)) {
      pFVar19 = (FILE *)0xf;
      if (local_1b8 != (pointer)&local_1a8) {
        pFVar19 = local_1a8;
      }
      if (pFVar19 < (FILE *)((long)local_1b0 + local_1f8._8_8_)) goto LAB_00156e7b;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,local_1f8._0_8_);
    }
    else {
LAB_00156e7b:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_1f8,(ulong)local_1b8);
    }
    local_110 = &local_100;
    puVar1 = puVar13 + 2;
    if ((undefined8 *)*puVar13 == puVar1) {
      local_100 = *puVar1;
      uStack_f8 = *(undefined4 *)(puVar13 + 3);
      uStack_f4 = *(undefined4 *)((long)puVar13 + 0x1c);
    }
    else {
      local_100 = *puVar1;
      local_110 = (undefined8 *)*puVar13;
    }
    local_108 = puVar13[1];
    *puVar13 = puVar1;
    puVar13[1] = 0;
    *(undefined1 *)puVar1 = 0;
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_110);
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_1b8 != (pointer)&local_1a8) {
      operator_delete(local_1b8);
    }
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
    goto LAB_00156f41;
  }
  if (uVar8 == 0xffffffff) {
    local_1f8._0_8_ = plVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"$26","");
    std::__cxx11::string::operator=((string *)&reg2_abi_cxx11_,(string *)local_1f8);
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "li ",&reg2_abi_cxx11_);
    plVar12 = (long *)std::__cxx11::string::append(local_1d8);
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_1f8._16_8_ = *plVar14;
      local_1f8._24_8_ = plVar12[3];
      local_1f8._0_8_ = plVar2;
    }
    else {
      local_1f8._16_8_ = *plVar14;
      local_1f8._0_8_ = (long *)*plVar12;
    }
    local_1f8._8_8_ = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append(local_1f8,local_130._M_allocated_capacity);
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_40 = *plVar14;
      uStack_38 = (undefined4)plVar12[3];
      uStack_34 = *(undefined4 *)((long)plVar12 + 0x1c);
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar14;
      local_50 = (long *)*plVar12;
    }
    local_48 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170,
                   &reg1_abi_cxx11_);
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
    local_1b8 = (pointer)&local_1a8;
    pPVar16 = (pointer)(puVar13 + 2);
    if ((pointer)*puVar13 == pPVar16) {
      local_1a8 = *(FILE **)pPVar16;
      _Stack_1a0._M_nxt = (_Hash_node_base *)puVar13[3];
    }
    else {
      local_1a8 = *(FILE **)pPVar16;
      local_1b8 = (pointer)*puVar13;
    }
    local_1b0 = (__buckets_ptr)puVar13[1];
    *puVar13 = pPVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_1b8,(ulong)reg2_abi_cxx11_._M_dataplus._M_p);
    pPVar16 = (pointer)(puVar13 + 2);
    if ((pointer)*puVar13 == pPVar16) {
      local_1d8._16_8_ = *(undefined8 *)pPVar16;
      local_1d8._24_8_ = puVar13[3];
      local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
    }
    else {
      local_1d8._16_8_ = *(undefined8 *)pPVar16;
      local_1d8._0_8_ = (pointer)*puVar13;
    }
    local_1d8._8_8_ = puVar13[1];
    *puVar13 = pPVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_1d8);
    plVar12 = puVar13 + 2;
    if ((long *)*puVar13 == plVar12) {
      local_1f8._16_8_ = *plVar12;
      local_1f8._24_8_ = puVar13[3];
      local_1f8._0_8_ = plVar2;
    }
    else {
      local_1f8._16_8_ = *plVar12;
      local_1f8._0_8_ = (long *)*puVar13;
    }
    local_1f8._8_8_ = puVar13[1];
    *puVar13 = plVar12;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append
                                (local_1f8,(ulong)reg3_abi_cxx11_._M_dataplus._M_p);
    plVar12 = &local_60;
    plVar17 = plVar14 + 2;
    if ((long *)*plVar14 == plVar17) {
      local_60 = *plVar17;
      uStack_58 = (undefined4)plVar14[3];
      uStack_54 = *(undefined4 *)((long)plVar14 + 0x1c);
      local_70 = plVar12;
    }
    else {
      local_60 = *plVar17;
      local_70 = (long *)*plVar14;
    }
    local_68 = plVar14[1];
    *plVar14 = (long)plVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_70);
    plVar14 = local_70;
LAB_00156dc3:
    if (plVar14 != plVar12) {
      operator_delete(plVar14);
    }
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (local_1b8 != (pointer)&local_1a8) {
LAB_00156df4:
      operator_delete(local_1b8);
    }
  }
  else {
    if (uVar9 == 0xffffffff) {
      local_1f8._0_8_ = plVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"$27","");
      std::__cxx11::string::operator=((string *)&reg3_abi_cxx11_,(string *)local_1f8);
      if ((long *)local_1f8._0_8_ != plVar2) {
        operator_delete((void *)local_1f8._0_8_);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "li ",&reg3_abi_cxx11_);
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_1d8);
      plVar12 = puVar13 + 2;
      if ((long *)*puVar13 == plVar12) {
        local_1f8._16_8_ = *plVar12;
        local_1f8._24_8_ = puVar13[3];
        local_1f8._0_8_ = plVar2;
      }
      else {
        local_1f8._16_8_ = *plVar12;
        local_1f8._0_8_ = (long *)*puVar13;
      }
      local_1f8._8_8_ = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append(local_1f8,local_150._M_allocated_capacity);
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_80 = *plVar14;
        uStack_78 = (undefined4)plVar12[3];
        uStack_74 = *(undefined4 *)((long)plVar12 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar14;
        local_90 = (long *)*plVar12;
      }
      local_88 = plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      fprintf((FILE *)this->m_fp_mips,"%s\n",local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if ((long *)local_1f8._0_8_ != plVar2) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_);
      }
      std::operator+(&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170
                     ,&reg1_abi_cxx11_);
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
      local_1b8 = (pointer)&local_1a8;
      pPVar16 = (pointer)(puVar13 + 2);
      if ((pointer)*puVar13 == pPVar16) {
        local_1a8 = *(FILE **)pPVar16;
        _Stack_1a0._M_nxt = (_Hash_node_base *)puVar13[3];
      }
      else {
        local_1a8 = *(FILE **)pPVar16;
        local_1b8 = (pointer)*puVar13;
      }
      local_1b0 = (__buckets_ptr)puVar13[1];
      *puVar13 = pPVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1b8,(ulong)reg2_abi_cxx11_._M_dataplus._M_p);
      pPVar16 = (pointer)(puVar13 + 2);
      if ((pointer)*puVar13 == pPVar16) {
        local_1d8._16_8_ = *(undefined8 *)pPVar16;
        local_1d8._24_8_ = puVar13[3];
        local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
      }
      else {
        local_1d8._16_8_ = *(undefined8 *)pPVar16;
        local_1d8._0_8_ = (pointer)*puVar13;
      }
      local_1d8._8_8_ = puVar13[1];
      *puVar13 = pPVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append(local_1d8);
      plVar12 = puVar13 + 2;
      if ((long *)*puVar13 == plVar12) {
        local_1f8._16_8_ = *plVar12;
        local_1f8._24_8_ = puVar13[3];
        local_1f8._0_8_ = plVar2;
      }
      else {
        local_1f8._16_8_ = *plVar12;
        local_1f8._0_8_ = (long *)*puVar13;
      }
      local_1f8._8_8_ = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  (local_1f8,(ulong)reg3_abi_cxx11_._M_dataplus._M_p);
      plVar12 = &local_a0;
      plVar17 = plVar14 + 2;
      if ((long *)*plVar14 == plVar17) {
        local_a0 = *plVar17;
        uStack_98 = (undefined4)plVar14[3];
        uStack_94 = *(undefined4 *)((long)plVar14 + 0x1c);
        local_b0 = plVar12;
      }
      else {
        local_a0 = *plVar17;
        local_b0 = (long *)*plVar14;
      }
      local_a8 = plVar14[1];
      *plVar14 = (long)plVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      fprintf((FILE *)this->m_fp_mips,"%s\n",local_b0);
      plVar14 = local_b0;
      goto LAB_00156dc3;
    }
    std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170,
                   &reg1_abi_cxx11_);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_190);
    pPVar16 = (pointer)(plVar12 + 2);
    if ((pointer)*plVar12 == pPVar16) {
      local_1a8 = *(FILE **)pPVar16;
      _Stack_1a0._M_nxt = (_Hash_node_base *)plVar12[3];
      local_1b8 = (pointer)&local_1a8;
    }
    else {
      local_1a8 = *(FILE **)pPVar16;
      local_1b8 = (pointer)*plVar12;
    }
    local_1b0 = (__buckets_ptr)plVar12[1];
    *plVar12 = (long)pPVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_1b8,(ulong)reg2_abi_cxx11_._M_dataplus._M_p);
    pPVar16 = (pointer)(plVar12 + 2);
    if ((pointer)*plVar12 == pPVar16) {
      local_1d8._16_8_ = *(undefined8 *)pPVar16;
      local_1d8._24_8_ = plVar12[3];
      local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
    }
    else {
      local_1d8._16_8_ = *(undefined8 *)pPVar16;
      local_1d8._0_8_ = (pointer)*plVar12;
    }
    local_1d8._8_8_ = plVar12[1];
    *plVar12 = (long)pPVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_1d8);
    plVar12 = puVar13 + 2;
    if ((long *)*puVar13 == plVar12) {
      local_1f8._16_8_ = *plVar12;
      local_1f8._24_8_ = puVar13[3];
      local_1f8._0_8_ = plVar2;
    }
    else {
      local_1f8._16_8_ = *plVar12;
      local_1f8._0_8_ = (long *)*puVar13;
    }
    local_1f8._8_8_ = puVar13[1];
    *puVar13 = plVar12;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append
                                (local_1f8,(ulong)reg3_abi_cxx11_._M_dataplus._M_p);
    plVar14 = plVar12 + 2;
    if ((long *)*plVar12 == plVar14) {
      local_c0 = *plVar14;
      uStack_b8 = (undefined4)plVar12[3];
      uStack_b4 = *(undefined4 *)((long)plVar12 + 0x1c);
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar14;
      local_d0 = (long *)*plVar12;
    }
    local_c8 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    fprintf((FILE *)this->m_fp_mips,"%s\n",local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if (local_1b8 != (pointer)&local_1a8) goto LAB_00156df4;
  }
  pbVar6 = &local_190;
LAB_00156f41:
  puVar5 = (undefined1 *)(&(pbVar6->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5 != &pbVar6->field_2) {
    operator_delete(puVar5);
  }
  if (local_194 == 1) {
    local_1f8._0_8_ = plVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
    local_1d8._0_8_ = (pointer)(local_1d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"t","");
    GenerateStore(this,&reg1_abi_cxx11_,&local_f0,(string *)local_1f8,(string *)local_1d8);
    if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_);
    }
    if ((long *)local_1f8._0_8_ != plVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_allocated_capacity != &local_160) {
    operator_delete((void *)local_170._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_allocated_capacity != &local_140) {
    operator_delete((void *)local_150._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_allocated_capacity != &local_120) {
    operator_delete((void *)local_130._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MipsGenerator::TranslateMULType(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    PcodeType op_type = item.GetOP();
    string op;
    if (op_type == MUL)
        op = string("mul ");
    else if (op_type == DIV)
        op = string("div ");
    else
        fprintf(stderr, "invalid mul type\n");
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value;
        if (op_type == MUL)
            value = atoi(num2.c_str()) * atoi(num3.c_str());
        else
            value = atoi(num2.c_str()) / atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        reg2 = NUM2;
        Output2File("li " + reg2 + " " + num2);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else if (ret3 == -1) {
        reg3 = NUM3;
        Output2File("li " + reg3 + " " + num3);
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    } else {
        Output2File(op + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}